

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end)

{
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
  *this_00;
  int source_row;
  undefined1 *puVar1;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar2;
  bool bVar3;
  parameter_type pVar4;
  bool bVar5;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  undefined1 *local_a8;
  undefined1 *local_90;
  undefined1 *puStack_88;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QModelIndex::isValid(source_parent);
  this_00 = &this->filter_recursive;
  pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
          ::value(this_00);
  if (pVar4 && bVar3) {
    source_row = source_parent->r;
    QModelIndex::parent((QModelIndex *)&local_58,source_parent);
    bVar5 = filterAcceptsRowInternal(this,source_row,(QModelIndex *)&local_58);
  }
  else {
    bVar5 = false;
  }
  pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
          ::value(this_00);
  if ((bVar5 == false) && (bVar3 && pVar4)) {
    local_a8 = *(undefined1 **)source_parent;
    puVar7 = (undefined1 *)source_parent->i;
    tVar6.ptr = (source_parent->m).ptr;
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)&local_58,source_parent);
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)&local_78,(QModelIndex *)&local_58);
    while (((-1 < (int)local_58 && (-1 < (long)local_58)) &&
           (local_48.ptr != (QAbstractItemModel *)0x0))) {
      bVar3 = filterAcceptsRowInternal(this,(int)local_58,(QModelIndex *)&local_78);
      tVar2.ptr = local_48.ptr;
      puVar1 = puStack_50;
      if (bVar3) break;
      local_a8 = local_58;
      local_58 = local_78;
      puStack_50 = puStack_70;
      local_48.ptr = local_68.ptr;
      QModelIndex::parent((QModelIndex *)&local_90,(QModelIndex *)&local_58);
      local_68.ptr = local_80.ptr;
      local_78 = local_90;
      puStack_70 = puStack_88;
      tVar6.ptr = tVar2.ptr;
      puVar7 = puVar1;
    }
    *(undefined1 **)&this->last_top_source = local_a8;
    (this->last_top_source).i = (quintptr)puVar7;
    (this->last_top_source).m.ptr = tVar6.ptr;
  }
  else {
    bVar3 = can_create_mapping(this,source_parent);
    if (bVar3) {
      create_mapping(this,source_parent);
    }
    pVar4 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
            ::value(this_00);
    if (pVar4) {
      this->complete_insert = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted(
    const QModelIndex &source_parent, int start, int end)
{
    Q_UNUSED(start);
    Q_UNUSED(end);

    const bool toplevel = !source_parent.isValid();
    const bool recursive_accepted = filter_recursive && !toplevel && filterAcceptsRowInternal(source_parent.row(), source_parent.parent());
    //Force the creation of a mapping now, even if it's empty.
    //We need it because the proxy can be accessed at the moment it emits rowsAboutToBeInserted in insert_source_items
    if (!filter_recursive || toplevel || recursive_accepted) {
        if (can_create_mapping(source_parent))
            create_mapping(source_parent);
        if (filter_recursive)
            complete_insert = true;
    } else {
        // The row could have been rejected or the parent might be not yet known... let's try to discover it
        QModelIndex top_source_parent = source_parent;
        QModelIndex parent = source_parent.parent();
        QModelIndex grandParent = parent.parent();

        while (parent.isValid() && !filterAcceptsRowInternal(parent.row(), grandParent)) {
            top_source_parent = parent;
            parent = grandParent;
            grandParent = parent.parent();
        }

        last_top_source = top_source_parent;
    }
}